

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall wasm::FunctionValidator::visitRefNull(FunctionValidator *this,RefNull *curr)

{
  Type *this_00;
  Function *func;
  bool bVar1;
  uintptr_t in_RAX;
  HeapType local_28;
  
  func = (this->
         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
         ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
         currFunction;
  if (func == (Function *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = (bool)(*(byte *)((long)&(((this->
                                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                      ).
                                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                      .
                                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                     .currModule)->features).features + 1) & 1);
  }
  local_28.id = in_RAX;
  ValidationInfo::shouldBeTrue<wasm::RefNull*>
            (this->info,bVar1,curr,"ref.null requires reference-types [--enable-reference-types]",
             func);
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type;
  bVar1 = wasm::Type::isNullable(this_00);
  bVar1 = ValidationInfo::shouldBeTrue<wasm::RefNull*>
                    (this->info,bVar1,curr,"ref.null types must be nullable",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if (bVar1) {
    bVar1 = wasm::Type::isRef(this_00);
    if (bVar1) {
      local_28 = wasm::Type::getHeapType(this_00);
      bVar1 = HeapType::isBottom(&local_28);
    }
    else {
      bVar1 = false;
    }
    ValidationInfo::shouldBeTrue<wasm::RefNull*>
              (this->info,bVar1,curr,"ref.null must have a bottom heap type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
  }
  return;
}

Assistant:

void FunctionValidator::visitRefNull(RefNull* curr) {
  // If we are not in a function, this is a global location like a table. We
  // allow RefNull there as we represent tables that way regardless of what
  // features are enabled.
  shouldBeTrue(!getFunction() || getModule()->features.hasReferenceTypes(),
               curr,
               "ref.null requires reference-types [--enable-reference-types]");
  if (!shouldBeTrue(
        curr->type.isNullable(), curr, "ref.null types must be nullable")) {
    return;
  }
  shouldBeTrue(
    curr->type.isNull(), curr, "ref.null must have a bottom heap type");
}